

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O3

bool embree::sse2::InstanceArrayIntersector1::pointQuery
               (PointQuery *query,PointQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float (*pafVar2) [16];
  float *pfVar3;
  float *pfVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  Geometry *pGVar9;
  long *plVar10;
  long lVar11;
  RTCPointQueryContext *pRVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 uVar22;
  ulong uVar23;
  bool bVar24;
  uint uVar25;
  ulong uVar26;
  long lVar27;
  float in_XMM0_Da;
  float in_XMM0_Db;
  float in_XMM0_Dc;
  float in_XMM0_Dd;
  float in_XMM1_Da;
  float fVar28;
  float in_XMM1_Db;
  float fVar29;
  float in_XMM1_Dc;
  float fVar30;
  float in_XMM1_Dd;
  float fVar31;
  float in_XMM2_Da;
  float fVar32;
  float in_XMM2_Db;
  float fVar33;
  float in_XMM2_Dc;
  float in_XMM2_Dd;
  float in_XMM3_Da;
  float in_XMM3_Db;
  float in_XMM3_Dc;
  float fVar34;
  float in_XMM3_Dd;
  float fVar35;
  float fVar36;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar43;
  float in_XMM5_Da;
  float in_XMM5_Db;
  float fVar44;
  float in_XMM5_Dc;
  float fVar45;
  float in_XMM5_Dd;
  vfloat4 a0_1;
  float fVar46;
  vfloat4 l02;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float in_XMM7_Da;
  float fVar49;
  float in_XMM7_Db;
  float fVar52;
  float in_XMM7_Dc;
  float fVar54;
  vfloat4 a0;
  undefined1 auVar50 [16];
  float fVar53;
  undefined1 auVar51 [16];
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  undefined1 auVar62 [12];
  float fVar63;
  float fVar64;
  undefined1 in_XMM9 [16];
  float fVar65;
  float fVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float in_XMM11_Da;
  float fVar69;
  float in_XMM11_Db;
  float in_XMM11_Dc;
  float in_XMM11_Dd;
  undefined1 auVar70 [16];
  float in_XMM12_Da;
  float in_XMM12_Db;
  float in_XMM12_Dc;
  float in_XMM13_Da;
  float fVar71;
  float fVar72;
  float in_XMM13_Db;
  float fVar73;
  float in_XMM13_Dc;
  float fVar74;
  float in_XMM13_Dd;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float local_e8;
  float fStack_e4;
  float fStack_b4;
  float fStack_94;
  undefined8 local_88;
  float local_80;
  float local_7c;
  float local_78;
  _func_int *local_68;
  undefined8 local_60;
  PointQuery *local_58;
  undefined4 local_50;
  PointQueryFunction local_48;
  RTCPointQueryContext *local_40;
  float local_38;
  void *local_30;
  undefined8 local_28;
  float local_18;
  float fStack_14;
  float fStack_10;
  float fStack_c;
  
  auVar62 = in_XMM9._0_12_;
  uVar26 = (ulong)prim->primID_;
  pGVar9 = (context->scene->geometries).items[prim->instID_].ptr;
  local_68 = *(_func_int **)&pGVar9->field_0x58;
  if ((local_68 == (_func_int *)0x0) &&
     ((uVar23 = (ulong)*(uint *)(*(long *)&pGVar9[1].time_range.upper +
                                (long)pGVar9[1].intersectionFilterN * uVar26), uVar23 == 0xffffffff
      || (local_68 = pGVar9[1].super_RefCount._vptr_RefCount[uVar23], local_68 == (_func_int *)0x0))
     )) {
    return false;
  }
  plVar10 = *(long **)&pGVar9[1].fnumTimeSegments;
  iVar8 = (int)plVar10[4];
  if ((pGVar9->field_8).field_0x1 == '\x01') {
    if (iVar8 < 0x9244) {
      if (iVar8 == 0x9134) {
        lVar11 = *plVar10;
        lVar27 = plVar10[2] * uVar26;
        in_XMM0_Db = *(float *)(lVar11 + 0x10 + lVar27);
        in_XMM0_Da = *(float *)(lVar11 + lVar27);
        in_XMM13_Da = *(float *)(lVar11 + 4 + lVar27);
        in_XMM11_Da = *(float *)(lVar11 + 8 + lVar27);
        in_XMM5_Da = *(float *)(lVar11 + 0xc + lVar27);
        in_XMM0_Dc = *(float *)(lVar11 + 0x20 + lVar27);
        in_XMM0_Dd = 0.0;
        in_XMM13_Db = *(float *)(lVar11 + 0x14 + lVar27);
        in_XMM13_Dc = *(float *)(lVar11 + 0x24 + lVar27);
        in_XMM13_Dd = 0.0;
        in_XMM11_Db = *(float *)(lVar11 + 0x18 + lVar27);
        in_XMM11_Dc = *(float *)(lVar11 + 0x28 + lVar27);
        in_XMM11_Dd = 0.0;
        in_XMM5_Db = *(float *)(lVar11 + 0x1c + lVar27);
        in_XMM5_Dc = *(float *)(lVar11 + 0x2c + lVar27);
        in_XMM5_Dd = 0.0;
      }
      else if (iVar8 == 0x9234) {
        lVar11 = *plVar10;
        lVar27 = plVar10[2] * uVar26;
        uVar5 = *(undefined8 *)(lVar11 + 4 + lVar27);
        in_XMM0_Db = (float)uVar5;
        in_XMM0_Dc = (float)((ulong)uVar5 >> 0x20);
        in_XMM0_Da = *(float *)(lVar11 + lVar27);
        in_XMM0_Dd = 0.0;
        uVar5 = *(undefined8 *)(lVar11 + 0x10 + lVar27);
        in_XMM13_Db = (float)uVar5;
        in_XMM13_Dc = (float)((ulong)uVar5 >> 0x20);
        in_XMM13_Da = *(float *)(lVar11 + 0xc + lVar27);
        in_XMM13_Dd = 0.0;
        uVar5 = *(undefined8 *)(lVar11 + 0x1c + lVar27);
        in_XMM11_Db = (float)uVar5;
        in_XMM11_Dc = (float)((ulong)uVar5 >> 0x20);
        in_XMM11_Da = *(float *)(lVar11 + 0x18 + lVar27);
        in_XMM11_Dd = 0.0;
        uVar5 = *(undefined8 *)(lVar11 + 0x28 + lVar27);
        in_XMM5_Db = (float)uVar5;
        in_XMM5_Dc = (float)((ulong)uVar5 >> 0x20);
        in_XMM5_Da = *(float *)(lVar11 + 0x24 + lVar27);
        in_XMM5_Dd = 0.0;
      }
    }
    else if (iVar8 == 0xb001) {
      lVar11 = *plVar10;
      lVar27 = plVar10[2] * uVar26;
      pfVar1 = (float *)(lVar11 + 0x10 + lVar27);
      in_XMM11_Da = *pfVar1;
      in_XMM11_Db = pfVar1[1];
      uVar5 = *(undefined8 *)(lVar11 + 0x34 + lVar27);
      in_XMM0_Db = (float)uVar5;
      in_XMM0_Dc = (float)((ulong)uVar5 >> 0x20);
      in_XMM0_Da = *(float *)(lVar11 + lVar27);
      in_XMM13_Db = *(float *)(lVar11 + 4 + lVar27);
      in_XMM11_Dc = *(float *)(lVar11 + 8 + lVar27);
      in_XMM13_Da = *(float *)(lVar11 + 0xc + lVar27);
      in_XMM5_Da = *(float *)(lVar11 + 0x18 + lVar27);
      uVar5 = *(undefined8 *)(lVar11 + 0x1c + lVar27);
      in_XMM5_Db = (float)uVar5;
      in_XMM5_Dc = (float)((ulong)uVar5 >> 0x20);
      fVar39 = *(float *)(lVar11 + 0x24 + lVar27);
      fVar41 = *(float *)(lVar11 + 0x28 + lVar27);
      fVar53 = *(float *)(lVar11 + 0x2c + lVar27);
      fVar28 = *(float *)(lVar11 + 0x30 + lVar27);
      fVar30 = fVar28 * fVar28 + fVar53 * fVar53 + fVar39 * fVar39 + fVar41 * fVar41;
      auVar38 = rsqrtss(ZEXT416((uint)fVar30),ZEXT416((uint)fVar30));
      fVar29 = auVar38._0_4_;
      fVar29 = fVar29 * fVar29 * fVar30 * -0.5 * fVar29 + fVar29 * 1.5;
      in_XMM5_Dd = fVar39 * fVar29;
      in_XMM0_Dd = fVar41 * fVar29;
      in_XMM13_Dd = fVar53 * fVar29;
      in_XMM11_Dd = fVar29 * fVar28;
      in_XMM13_Dc = *(float *)(lVar11 + 0x3c + lVar27);
    }
    else if (iVar8 == 0x9244) {
      lVar11 = *plVar10;
      lVar27 = plVar10[2] * uVar26;
      pfVar1 = (float *)(lVar11 + lVar27);
      in_XMM0_Da = *pfVar1;
      in_XMM0_Db = pfVar1[1];
      in_XMM0_Dc = pfVar1[2];
      in_XMM0_Dd = pfVar1[3];
      pfVar1 = (float *)(lVar11 + 0x10 + lVar27);
      in_XMM13_Da = *pfVar1;
      in_XMM13_Db = pfVar1[1];
      in_XMM13_Dc = pfVar1[2];
      in_XMM13_Dd = pfVar1[3];
      pfVar1 = (float *)(lVar11 + 0x20 + lVar27);
      in_XMM11_Da = *pfVar1;
      in_XMM11_Db = pfVar1[1];
      in_XMM11_Dc = pfVar1[2];
      in_XMM11_Dd = pfVar1[3];
      pfVar1 = (float *)(lVar11 + 0x30 + lVar27);
      in_XMM5_Da = *pfVar1;
      in_XMM5_Db = pfVar1[1];
      in_XMM5_Dc = pfVar1[2];
      in_XMM5_Dd = pfVar1[3];
    }
    fVar57 = in_XMM0_Dd * in_XMM13_Dd + in_XMM11_Dd * in_XMM5_Dd;
    fVar56 = in_XMM0_Dd * in_XMM13_Dd - in_XMM11_Dd * in_XMM5_Dd;
    fVar41 = in_XMM5_Dd * in_XMM5_Dd - in_XMM0_Dd * in_XMM0_Dd;
    fVar32 = in_XMM5_Dd * in_XMM5_Dd + in_XMM0_Dd * in_XMM0_Dd + -in_XMM13_Dd * in_XMM13_Dd +
             -in_XMM11_Dd * in_XMM11_Dd;
    fVar53 = in_XMM13_Dd * in_XMM13_Dd + fVar41 + -in_XMM11_Dd * in_XMM11_Dd;
    fVar58 = in_XMM0_Dd * in_XMM11_Dd - in_XMM13_Dd * in_XMM5_Dd;
    fVar28 = in_XMM13_Dd * in_XMM5_Dd + in_XMM0_Dd * in_XMM11_Dd;
    fVar33 = in_XMM13_Dd * in_XMM11_Dd + in_XMM0_Dd * in_XMM5_Dd;
    fVar39 = in_XMM13_Dd * in_XMM11_Dd - in_XMM0_Dd * in_XMM5_Dd;
    fVar57 = fVar57 + fVar57;
    fVar58 = fVar58 + fVar58;
    fVar56 = fVar56 + fVar56;
    fVar33 = fVar33 + fVar33;
    fVar28 = fVar28 + fVar28;
    fVar39 = fVar39 + fVar39;
    fVar31 = in_XMM11_Dd * in_XMM11_Dd + fVar41 + -in_XMM13_Dd * in_XMM13_Dd;
    fVar41 = fVar32 * 1.0 + fVar57 * 0.0 + fVar58 * 0.0;
    fVar29 = fVar32 * 0.0 + fVar57 * 1.0 + fVar58 * 0.0;
    fVar30 = fVar32 * 0.0 + fVar57 * 0.0 + fVar58 * 1.0;
    fVar57 = fVar32 * 0.0 + fVar57 * 0.0 + fVar58 * 0.0;
    fVar44 = fVar56 * 1.0 + fVar53 * 0.0 + fVar33 * 0.0;
    fVar45 = fVar56 * 0.0 + fVar53 * 1.0 + fVar33 * 0.0;
    fVar46 = fVar56 * 0.0 + fVar53 * 0.0 + fVar33 * 1.0;
    fVar66 = fVar56 * 0.0 + fVar53 * 0.0 + fVar33 * 0.0;
    fVar53 = fVar28 * 1.0 + fVar39 * 0.0 + fVar31 * 0.0;
    fVar32 = fVar28 * 0.0 + fVar39 * 1.0 + fVar31 * 0.0;
    fStack_94 = fVar28 * 0.0 + fVar39 * 0.0 + fVar31 * 1.0;
    fVar33 = fVar28 * 0.0 + fVar39 * 0.0 + fVar31 * 0.0;
    fVar69 = in_XMM0_Db + 0.0;
    fVar71 = in_XMM0_Dc + 0.0;
    local_e8 = in_XMM11_Dc * fVar53;
    fStack_e4 = in_XMM11_Dc * fVar32;
    fVar31 = in_XMM11_Dc * fStack_94;
    fVar58 = in_XMM11_Dc * fVar33;
    fVar39 = in_XMM5_Dc * fVar53;
    fVar28 = in_XMM5_Dc * fVar32;
    fStack_b4 = in_XMM5_Dc * fStack_94;
    fVar56 = in_XMM5_Dc * fVar33;
    fVar53 = fVar53 * 0.0;
    fVar32 = fVar32 * 0.0;
    fStack_94 = fStack_94 * 0.0;
    fVar33 = fVar33 * 0.0;
    fVar49 = fVar44 * 0.0 + fVar53;
    fVar52 = fVar45 * 0.0 + fVar32;
    fVar54 = fVar46 * 0.0 + fStack_94;
    fVar55 = fVar66 * 0.0 + fVar33;
    fVar72 = in_XMM13_Db * fVar44 + fVar53;
    fVar73 = in_XMM13_Db * fVar45 + fVar32;
    fVar74 = in_XMM13_Db * fVar46 + fStack_94;
    fVar75 = in_XMM13_Db * fVar66 + fVar33;
    fVar76 = in_XMM11_Db * fVar44 + local_e8;
    fVar77 = in_XMM11_Db * fVar45 + fStack_e4;
    fVar78 = in_XMM11_Db * fVar46 + fVar31;
    fVar79 = in_XMM11_Db * fVar66 + fVar58;
    fVar36 = in_XMM5_Db * fVar44 + fVar39;
    fVar40 = in_XMM5_Db * fVar45 + fVar28;
    fVar42 = in_XMM5_Db * fVar46 + fStack_b4;
    fVar43 = in_XMM5_Db * fVar66 + fVar56;
    fVar44 = in_XMM0_Da * fVar41;
    fVar45 = in_XMM0_Da * fVar29;
    fVar46 = in_XMM0_Da * fVar30;
    fVar66 = in_XMM0_Da * fVar57;
    fVar64 = in_XMM13_Da * fVar41;
    fVar65 = in_XMM13_Da * fVar29;
    fVar34 = in_XMM13_Da * fVar30;
    fVar35 = in_XMM13_Da * fVar57;
    fVar59 = in_XMM11_Da * fVar41;
    fVar60 = in_XMM11_Da * fVar29;
    fVar61 = in_XMM11_Da * fVar30;
    fVar63 = in_XMM11_Da * fVar57;
    fVar80 = in_XMM5_Da * fVar41;
    fVar81 = in_XMM5_Da * fVar29;
    fVar82 = in_XMM5_Da * fVar30;
    fVar83 = in_XMM5_Da * fVar57;
    plVar10 = *(long **)&pGVar9[1].fnumTimeSegments;
    iVar8 = (int)plVar10[4];
    if (iVar8 < 0x9244) {
      if (iVar8 == 0x9134) {
        lVar11 = *plVar10;
        lVar27 = uVar26 * plVar10[2];
        fVar28 = *(float *)(lVar11 + 0x10 + lVar27);
        fVar39 = *(float *)(lVar11 + lVar27);
        fVar41 = *(float *)(lVar11 + 4 + lVar27);
        local_e8 = *(float *)(lVar11 + 8 + lVar27);
        fVar53 = *(float *)(lVar11 + 0xc + lVar27);
        fStack_b4 = *(float *)(lVar11 + 0x20 + lVar27);
        fVar56 = 0.0;
        fVar29 = *(float *)(lVar11 + 0x14 + lVar27);
        fVar30 = *(float *)(lVar11 + 0x24 + lVar27);
        fVar57 = 0.0;
        fStack_e4 = *(float *)(lVar11 + 0x18 + lVar27);
        fVar31 = *(float *)(lVar11 + 0x28 + lVar27);
        fVar58 = 0.0;
        fVar32 = *(float *)(lVar11 + 0x1c + lVar27);
        fStack_94 = *(float *)(lVar11 + 0x2c + lVar27);
        fVar33 = 0.0;
      }
      else if (iVar8 == 0x9234) {
        lVar11 = *plVar10;
        lVar27 = uVar26 * plVar10[2];
        uVar5 = *(undefined8 *)(lVar11 + 4 + lVar27);
        fVar39 = *(float *)(lVar11 + lVar27);
        fVar28 = (float)uVar5;
        fStack_b4 = (float)((ulong)uVar5 >> 0x20);
        fVar56 = 0.0;
        uVar5 = *(undefined8 *)(lVar11 + 0x10 + lVar27);
        fVar41 = *(float *)(lVar11 + 0xc + lVar27);
        fVar29 = (float)uVar5;
        fVar30 = (float)((ulong)uVar5 >> 0x20);
        fVar57 = 0.0;
        uVar5 = *(undefined8 *)(lVar11 + 0x1c + lVar27);
        local_e8 = *(float *)(lVar11 + 0x18 + lVar27);
        fStack_e4 = (float)uVar5;
        fVar31 = (float)((ulong)uVar5 >> 0x20);
        fVar58 = 0.0;
        uVar5 = *(undefined8 *)(lVar11 + 0x28 + lVar27);
        fVar53 = *(float *)(lVar11 + 0x24 + lVar27);
        fVar32 = (float)uVar5;
        fStack_94 = (float)((ulong)uVar5 >> 0x20);
        fVar33 = 0.0;
      }
    }
    else if (iVar8 == 0xb001) {
      lVar11 = *plVar10;
      lVar27 = uVar26 * plVar10[2];
      uVar5 = *(undefined8 *)(lVar11 + 0x10 + lVar27);
      uVar6 = *(undefined8 *)(lVar11 + 0x34 + lVar27);
      fVar39 = *(float *)(lVar11 + lVar27);
      fVar29 = *(float *)(lVar11 + 4 + lVar27);
      fVar31 = *(float *)(lVar11 + 8 + lVar27);
      fVar41 = *(float *)(lVar11 + 0xc + lVar27);
      fVar28 = (float)uVar6;
      fVar53 = *(float *)(lVar11 + 0x18 + lVar27);
      uVar7 = *(undefined8 *)(lVar11 + 0x1c + lVar27);
      fVar33 = *(float *)(lVar11 + 0x24 + lVar27);
      fVar56 = *(float *)(lVar11 + 0x28 + lVar27);
      fVar57 = *(float *)(lVar11 + 0x2c + lVar27);
      fVar30 = *(float *)(lVar11 + 0x30 + lVar27);
      fVar58 = fVar30 * fVar30 + fVar57 * fVar57 + fVar33 * fVar33 + fVar56 * fVar56;
      auVar38 = rsqrtss(ZEXT416((uint)fVar58),ZEXT416((uint)fVar58));
      fVar32 = auVar38._0_4_;
      fVar58 = fVar32 * fVar32 * fVar58 * -0.5 * fVar32 + fVar32 * 1.5;
      fVar33 = fVar33 * fVar58;
      fVar56 = fVar56 * fVar58;
      fVar57 = fVar57 * fVar58;
      fVar58 = fVar58 * fVar30;
      local_e8 = (float)uVar5;
      fStack_e4 = (float)((ulong)uVar5 >> 0x20);
      fStack_b4 = (float)((ulong)uVar6 >> 0x20);
      fVar30 = *(float *)(lVar11 + 0x3c + lVar27);
      fStack_94 = (float)((ulong)uVar7 >> 0x20);
      fVar32 = (float)uVar7;
    }
    else if (iVar8 == 0x9244) {
      lVar11 = *plVar10;
      lVar27 = uVar26 * plVar10[2];
      pfVar1 = (float *)(lVar11 + lVar27);
      fVar39 = *pfVar1;
      fVar28 = pfVar1[1];
      fStack_b4 = pfVar1[2];
      fVar56 = pfVar1[3];
      pfVar1 = (float *)(lVar11 + 0x10 + lVar27);
      fVar41 = *pfVar1;
      fVar29 = pfVar1[1];
      fVar30 = pfVar1[2];
      fVar57 = pfVar1[3];
      pfVar1 = (float *)(lVar11 + 0x20 + lVar27);
      local_e8 = *pfVar1;
      fStack_e4 = pfVar1[1];
      fVar31 = pfVar1[2];
      fVar58 = pfVar1[3];
      pfVar1 = (float *)(lVar11 + 0x30 + lVar27);
      fVar53 = *pfVar1;
      fVar32 = pfVar1[1];
      fStack_94 = pfVar1[2];
      fVar33 = pfVar1[3];
    }
    in_XMM0_Da = fVar44 + fVar49;
    in_XMM0_Db = fVar45 + fVar52;
    in_XMM0_Dc = fVar46 + fVar54;
    in_XMM0_Dd = fVar66 + fVar55;
    in_XMM3_Da = fVar64 + fVar72;
    in_XMM3_Db = fVar65 + fVar73;
    in_XMM3_Dc = fVar34 + fVar74;
    in_XMM3_Dd = fVar35 + fVar75;
    in_XMM2_Da = fVar59 + fVar76;
    in_XMM2_Db = fVar60 + fVar77;
    in_XMM2_Dc = fVar61 + fVar78;
    in_XMM2_Dd = fVar63 + fVar79;
    in_XMM1_Da = fVar69 + fVar80 + fVar36;
    in_XMM1_Db = fVar71 + fVar81 + fVar40;
    in_XMM1_Dc = in_XMM13_Dc + 0.0 + fVar82 + fVar42;
    in_XMM1_Dd = fVar83 + fVar43 + 0.0;
    fVar44 = fVar56 * fVar57 + fVar58 * fVar33;
    fVar66 = fVar56 * fVar57 - fVar58 * fVar33;
    fVar60 = fVar33 * fVar33 - fVar56 * fVar56;
    fVar59 = fVar33 * fVar33 + fVar56 * fVar56 + -fVar57 * fVar57 + -fVar58 * fVar58;
    fVar45 = fVar57 * fVar57 + fVar60 + -fVar58 * fVar58;
    fVar69 = fVar56 * fVar58 - fVar57 * fVar33;
    fVar71 = fVar57 * fVar33 + fVar56 * fVar58;
    fVar46 = fVar57 * fVar58 + fVar56 * fVar33;
    fVar33 = fVar57 * fVar58 - fVar56 * fVar33;
    fVar61 = fVar58 * fVar58 + fVar60 + -fVar57 * fVar57;
    fVar44 = fVar44 + fVar44;
    fVar69 = fVar69 + fVar69;
    fVar58 = fVar59 * 1.0 + fVar44 * 0.0 + fVar69 * 0.0;
    fVar60 = fVar59 * 0.0 + fVar44 * 1.0 + fVar69 * 0.0;
    fVar44 = fVar59 * 0.0 + fVar44 * 0.0 + fVar69 * 1.0;
    fVar46 = fVar46 + fVar46;
    fVar66 = fVar66 + fVar66;
    fVar69 = fVar66 * 1.0 + fVar45 * 0.0 + fVar46 * 0.0;
    fVar59 = fVar66 * 0.0 + fVar45 * 1.0 + fVar46 * 0.0;
    fVar45 = fVar66 * 0.0 + fVar45 * 0.0 + fVar46 * 1.0;
    fVar71 = fVar71 + fVar71;
    fVar33 = fVar33 + fVar33;
    fVar56 = fVar71 * 1.0 + fVar33 * 0.0 + fVar61 * 0.0;
    fVar57 = fVar71 * 0.0 + fVar33 * 1.0 + fVar61 * 0.0;
    fVar33 = fVar71 * 0.0 + fVar33 * 0.0 + fVar61 * 1.0;
    in_XMM5_Da = fVar39 * fVar58 + fVar69 * 0.0 + fVar56 * 0.0;
    in_XMM5_Db = fVar39 * fVar60 + fVar59 * 0.0 + fVar57 * 0.0;
    in_XMM5_Dc = fVar39 * fVar44 + fVar45 * 0.0 + fVar33 * 0.0;
    in_XMM7_Da = fVar41 * fVar58 + fVar29 * fVar69 + fVar56 * 0.0;
    in_XMM7_Db = fVar41 * fVar60 + fVar29 * fVar59 + fVar57 * 0.0;
    in_XMM7_Dc = fVar41 * fVar44 + fVar29 * fVar45 + fVar33 * 0.0;
    in_XMM12_Da = local_e8 * fVar58 + fStack_e4 * fVar69 + fVar31 * fVar56;
    in_XMM12_Db = local_e8 * fVar60 + fStack_e4 * fVar59 + fVar31 * fVar57;
    in_XMM12_Dc = local_e8 * fVar44 + fStack_e4 * fVar45 + fVar31 * fVar33;
    auVar62._0_4_ = fVar53 * fVar58 + fVar32 * fVar69 + fStack_94 * fVar56 + fVar28 + 0.0;
    auVar62._4_4_ = fVar53 * fVar60 + fVar32 * fVar59 + fStack_94 * fVar57 + fStack_b4 + 0.0;
    auVar62._8_4_ = fVar53 * fVar44 + fVar32 * fVar45 + fStack_94 * fVar33 + fVar30 + 0.0;
  }
  else {
    if (iVar8 < 0x9244) {
      if (iVar8 == 0x9134) {
        lVar11 = *plVar10;
        lVar27 = uVar26 * plVar10[2];
        in_XMM0_Db = *(float *)(lVar11 + 0x10 + lVar27);
        in_XMM0_Da = *(float *)(lVar11 + lVar27);
        in_XMM3_Da = *(float *)(lVar11 + 4 + lVar27);
        in_XMM2_Da = *(float *)(lVar11 + 8 + lVar27);
        in_XMM1_Da = *(float *)(lVar11 + 0xc + lVar27);
        in_XMM0_Dc = *(float *)(lVar11 + 0x20 + lVar27);
        in_XMM0_Dd = 0.0;
        in_XMM3_Db = *(float *)(lVar11 + 0x14 + lVar27);
        in_XMM3_Dc = *(float *)(lVar11 + 0x24 + lVar27);
        in_XMM3_Dd = 0.0;
        in_XMM2_Db = *(float *)(lVar11 + 0x18 + lVar27);
        in_XMM2_Dc = *(float *)(lVar11 + 0x28 + lVar27);
        in_XMM2_Dd = 0.0;
        in_XMM1_Db = *(float *)(lVar11 + 0x1c + lVar27);
        in_XMM1_Dc = *(float *)(lVar11 + 0x2c + lVar27);
        in_XMM1_Dd = 0.0;
      }
      else {
        if (iVar8 != 0x9234) goto LAB_00a0479a;
        lVar11 = *plVar10;
        lVar27 = uVar26 * plVar10[2];
        uVar5 = *(undefined8 *)(lVar11 + 4 + lVar27);
        in_XMM0_Db = (float)uVar5;
        in_XMM0_Dc = (float)((ulong)uVar5 >> 0x20);
        in_XMM0_Da = *(float *)(lVar11 + lVar27);
        in_XMM0_Dd = 0.0;
        uVar5 = *(undefined8 *)(lVar11 + 0x10 + lVar27);
        in_XMM3_Db = (float)uVar5;
        in_XMM3_Dc = (float)((ulong)uVar5 >> 0x20);
        in_XMM3_Da = *(float *)(lVar11 + 0xc + lVar27);
        in_XMM3_Dd = 0.0;
        uVar5 = *(undefined8 *)(lVar11 + 0x1c + lVar27);
        in_XMM2_Db = (float)uVar5;
        in_XMM2_Dc = (float)((ulong)uVar5 >> 0x20);
        in_XMM2_Da = *(float *)(lVar11 + 0x18 + lVar27);
        in_XMM2_Dd = 0.0;
        uVar5 = *(undefined8 *)(lVar11 + 0x28 + lVar27);
        in_XMM1_Da = *(float *)(lVar11 + 0x24 + lVar27);
        in_XMM1_Db = (float)uVar5;
        in_XMM1_Dc = (float)((ulong)uVar5 >> 0x20);
        in_XMM1_Dd = 0.0;
      }
    }
    else if (iVar8 == 0xb001) {
      lVar11 = *plVar10;
      lVar27 = uVar26 * plVar10[2];
      uVar5 = *(undefined8 *)(lVar11 + 0x10 + lVar27);
      in_XMM2_Da = (float)uVar5;
      in_XMM2_Db = (float)((ulong)uVar5 >> 0x20);
      uVar5 = *(undefined8 *)(lVar11 + 0x34 + lVar27);
      in_XMM0_Da = *(float *)(lVar11 + lVar27);
      in_XMM3_Db = *(float *)(lVar11 + 4 + lVar27);
      in_XMM2_Dc = *(float *)(lVar11 + 8 + lVar27);
      in_XMM3_Da = *(float *)(lVar11 + 0xc + lVar27);
      in_XMM0_Db = (float)uVar5;
      in_XMM0_Dc = (float)((ulong)uVar5 >> 0x20);
      in_XMM1_Da = *(float *)(lVar11 + 0x18 + lVar27);
      uVar5 = *(undefined8 *)(lVar11 + 0x1c + lVar27);
      in_XMM1_Db = (float)uVar5;
      in_XMM1_Dc = (float)((ulong)uVar5 >> 0x20);
      fVar39 = *(float *)(lVar11 + 0x24 + lVar27);
      fVar41 = *(float *)(lVar11 + 0x28 + lVar27);
      fVar53 = *(float *)(lVar11 + 0x2c + lVar27);
      fVar28 = *(float *)(lVar11 + 0x30 + lVar27);
      fVar30 = fVar28 * fVar28 + fVar53 * fVar53 + fVar39 * fVar39 + fVar41 * fVar41;
      auVar38 = rsqrtss(ZEXT416((uint)fVar30),ZEXT416((uint)fVar30));
      fVar29 = auVar38._0_4_;
      fVar29 = fVar29 * fVar29 * fVar30 * -0.5 * fVar29 + fVar29 * 1.5;
      in_XMM1_Dd = fVar39 * fVar29;
      in_XMM0_Dd = fVar41 * fVar29;
      in_XMM3_Dd = fVar53 * fVar29;
      in_XMM2_Dd = fVar29 * fVar28;
      in_XMM3_Dc = *(float *)(lVar11 + 0x3c + lVar27);
    }
    else {
      if (iVar8 != 0x9244) goto LAB_00a0479a;
      lVar11 = *plVar10;
      lVar27 = uVar26 * plVar10[2];
      pfVar1 = (float *)(lVar11 + lVar27);
      in_XMM0_Da = *pfVar1;
      in_XMM0_Db = pfVar1[1];
      in_XMM0_Dc = pfVar1[2];
      in_XMM0_Dd = pfVar1[3];
      pfVar1 = (float *)(lVar11 + 0x10 + lVar27);
      in_XMM3_Da = *pfVar1;
      in_XMM3_Db = pfVar1[1];
      in_XMM3_Dc = pfVar1[2];
      in_XMM3_Dd = pfVar1[3];
      pfVar1 = (float *)(lVar11 + 0x20 + lVar27);
      in_XMM2_Da = *pfVar1;
      in_XMM2_Db = pfVar1[1];
      in_XMM2_Dc = pfVar1[2];
      in_XMM2_Dd = pfVar1[3];
      pfVar1 = (float *)(lVar11 + 0x30 + lVar27);
      in_XMM1_Da = *pfVar1;
      in_XMM1_Db = pfVar1[1];
      in_XMM1_Dc = pfVar1[2];
      in_XMM1_Dd = pfVar1[3];
    }
    auVar62._4_4_ = in_XMM1_Db;
    auVar62._0_4_ = in_XMM1_Da;
    auVar62._8_4_ = in_XMM1_Dc;
    in_XMM5_Da = in_XMM0_Da;
    in_XMM5_Db = in_XMM0_Db;
    in_XMM5_Dc = in_XMM0_Dc;
    in_XMM12_Da = in_XMM2_Da;
    in_XMM12_Db = in_XMM2_Db;
    in_XMM12_Dc = in_XMM2_Dc;
    in_XMM7_Da = in_XMM3_Da;
    in_XMM7_Db = in_XMM3_Db;
    in_XMM7_Dc = in_XMM3_Dc;
  }
LAB_00a0479a:
  auVar37._0_4_ = in_XMM7_Da * in_XMM12_Db - in_XMM12_Da * in_XMM7_Db;
  fVar39 = in_XMM7_Db * in_XMM12_Dc - in_XMM12_Db * in_XMM7_Dc;
  fVar41 = in_XMM7_Dc * in_XMM12_Da - in_XMM12_Dc * in_XMM7_Da;
  auVar37._4_4_ = in_XMM12_Da * in_XMM5_Db - in_XMM12_Db * in_XMM5_Da;
  auVar37._8_4_ = in_XMM7_Db * in_XMM5_Da - in_XMM5_Db * in_XMM7_Da;
  auVar37._12_4_ = 0;
  auVar50._4_4_ = in_XMM12_Db * in_XMM5_Dc - in_XMM12_Dc * in_XMM5_Db;
  auVar50._0_4_ = fVar39;
  auVar50._8_4_ = in_XMM7_Dc * in_XMM5_Db - in_XMM5_Dc * in_XMM7_Db;
  auVar50._12_4_ = 0;
  auVar47._4_4_ = in_XMM12_Dc * in_XMM5_Da - in_XMM12_Da * in_XMM5_Dc;
  auVar47._0_4_ = fVar41;
  auVar47._8_4_ = in_XMM7_Da * in_XMM5_Dc - in_XMM5_Da * in_XMM7_Dc;
  auVar47._12_4_ = 0;
  fVar39 = in_XMM5_Dc * auVar37._0_4_ + in_XMM5_Db * fVar41 + in_XMM5_Da * fVar39;
  auVar38._4_4_ = fVar39;
  auVar38._0_4_ = fVar39;
  auVar38._8_4_ = fVar39;
  auVar38._12_4_ = fVar39;
  auVar50 = divps(auVar50,auVar38);
  auVar48._4_4_ = fVar39;
  auVar48._0_4_ = fVar39;
  auVar48._8_4_ = fVar39;
  auVar48._12_4_ = fVar39;
  auVar48 = divps(auVar47,auVar48);
  auVar17._4_4_ = fVar39;
  auVar17._0_4_ = fVar39;
  auVar17._8_4_ = fVar39;
  auVar17._12_4_ = fVar39;
  auVar38 = divps(auVar37,auVar17);
  fVar44 = auVar62._0_4_;
  fVar45 = auVar62._4_4_;
  fVar46 = auVar62._8_4_;
  fVar39 = auVar38._0_4_;
  fVar41 = auVar38._4_4_;
  fVar53 = auVar38._8_4_;
  fVar28 = auVar48._0_4_;
  fVar29 = auVar48._4_4_;
  fVar30 = auVar48._8_4_;
  fVar31 = auVar50._0_4_;
  fVar32 = auVar50._4_4_;
  fVar33 = auVar50._8_4_;
  fVar56 = fVar44 * fVar31 + fVar45 * fVar28 + fVar46 * fVar39;
  fVar57 = fVar44 * fVar32 + fVar45 * fVar29 + fVar46 * fVar41;
  fVar58 = fVar44 * fVar33 + fVar45 * fVar30 + fVar46 * fVar53;
  local_50 = 2;
  bVar24 = true;
  local_38 = 0.0;
  if ((((context->query_type == POINT_QUERY_TYPE_SPHERE) &&
       (ABS(fVar33 * fVar30 + fVar32 * fVar29 + fVar31 * fVar28) <= 1e-05)) &&
      (ABS(fVar33 * fVar53 + fVar32 * fVar41 + fVar31 * fVar39) <= 1e-05)) &&
     (ABS(fVar30 * fVar53 + fVar29 * fVar41 + fVar28 * fVar39) <= 1e-05)) {
    fVar66 = fVar33 * fVar33 + fVar32 * fVar32 + fVar31 * fVar31;
    fVar69 = fVar30 * fVar30 + fVar29 * fVar29 + fVar28 * fVar28;
    if (((ABS(fVar66 - fVar69) <= 1e-05) &&
        (fVar71 = fVar53 * fVar53 + fVar41 * fVar41 + fVar39 * fVar39, ABS(fVar66 - fVar71) <= 1e-05
        )) && (ABS(fVar69 - fVar71) <= 1e-05)) {
      local_38 = SQRT(fVar66);
      local_50 = 1;
      bVar24 = false;
    }
  }
  pRVar12 = context->userContext;
  uVar25 = pRVar12->instStackSize;
  *(ulong *)(pRVar12->instID + uVar25) = CONCAT44((*prim).primID_,(*prim).instID_);
  *(undefined1 (*) [16])pRVar12->world2inst[uVar25] = auVar50;
  *(undefined1 (*) [16])(pRVar12->world2inst[uVar25] + 4) = auVar48;
  *(undefined1 (*) [16])(pRVar12->world2inst[uVar25] + 8) = auVar38;
  pfVar1 = pRVar12->world2inst[uVar25] + 0xc;
  *pfVar1 = -fVar56;
  pfVar1[1] = -fVar57;
  pfVar1[2] = -fVar58;
  pfVar1[3] = -(fVar44 * auVar50._12_4_ + fVar45 * auVar48._12_4_ + fVar46 * auVar38._12_4_);
  pafVar2 = pRVar12->inst2world + uVar25;
  (*pafVar2)[0] = in_XMM0_Da;
  (*pafVar2)[1] = in_XMM0_Db;
  (*pafVar2)[2] = in_XMM0_Dc;
  (*pafVar2)[3] = in_XMM0_Dd;
  pfVar1 = pRVar12->inst2world[uVar25] + 4;
  *pfVar1 = in_XMM3_Da;
  pfVar1[1] = in_XMM3_Db;
  pfVar1[2] = in_XMM3_Dc;
  pfVar1[3] = in_XMM3_Dd;
  pfVar1 = pRVar12->inst2world[uVar25] + 8;
  *pfVar1 = in_XMM2_Da;
  pfVar1[1] = in_XMM2_Db;
  pfVar1[2] = in_XMM2_Dc;
  pfVar1[3] = in_XMM2_Dd;
  pfVar1 = pRVar12->inst2world[uVar25] + 0xc;
  *pfVar1 = in_XMM1_Da;
  pfVar1[1] = in_XMM1_Db;
  pfVar1[2] = in_XMM1_Dc;
  pfVar1[3] = in_XMM1_Dd;
  pRVar12->instStackSize = pRVar12->instStackSize + 1;
  local_7c = query->time;
  fVar44 = (query->p).field_0.field_0.x;
  fVar45 = (query->p).field_0.field_0.y;
  fVar46 = (query->p).field_0.field_0.z;
  local_80 = fVar44 * fVar33 + fVar45 * fVar30 + (fVar46 * fVar53 - fVar58);
  local_88 = CONCAT44(fVar44 * fVar32 + fVar45 * fVar29 + (fVar46 * fVar41 - fVar57),
                      fVar44 * fVar31 + fVar45 * fVar28 + (fVar46 * fVar39 - fVar56));
  local_78 = query->radius * local_38;
  local_58 = context->query_ws;
  local_48 = context->func;
  local_40 = context->userContext;
  local_30 = context->userPtr;
  local_60 = 0;
  local_28 = 0xffffffffffffffff;
  local_18 = local_58->radius;
  if (bVar24) {
    fStack_14 = local_18;
    fStack_10 = local_18;
    fStack_c = local_18;
    if ((local_18 < INFINITY) && (local_40->instStackSize != 0)) {
      uVar25 = local_40->instStackSize - 1;
      pafVar2 = local_40->world2inst + uVar25;
      pfVar1 = local_40->world2inst[uVar25] + 4;
      pfVar3 = local_40->world2inst[uVar25] + 8;
      pfVar4 = local_40->world2inst[uVar25] + 0xc;
      fVar32 = *pfVar4 - *pfVar3 * local_18;
      fVar33 = pfVar4[1] - pfVar3[1] * local_18;
      fVar56 = pfVar4[2] - pfVar3[2] * local_18;
      fVar57 = pfVar4[3] - pfVar3[3] * local_18;
      fVar58 = -local_18 * *pfVar1;
      fVar44 = -local_18 * pfVar1[1];
      fVar45 = -local_18 * pfVar1[2];
      fVar46 = -local_18 * pfVar1[3];
      fVar69 = fVar58 + fVar32;
      fVar71 = fVar44 + fVar33;
      fVar59 = fVar45 + fVar56;
      fVar60 = fVar46 + fVar57;
      fVar39 = -local_18 * (*pafVar2)[0];
      fVar41 = -local_18 * (*pafVar2)[1];
      fVar53 = -local_18 * (*pafVar2)[2];
      fVar66 = -local_18 * (*pafVar2)[3];
      auVar70._0_4_ = fVar39 + fVar69;
      auVar70._4_4_ = fVar41 + fVar71;
      auVar70._8_4_ = fVar53 + fVar59;
      auVar70._12_4_ = fVar66 + fVar60;
      auVar38 = minps(_DAT_01f7a9f0,auVar70);
      auVar48 = maxps(_DAT_01f7aa00,auVar70);
      fVar61 = *pfVar3 * local_18 + *pfVar4;
      fVar63 = pfVar3[1] * local_18 + pfVar4[1];
      fVar64 = pfVar3[2] * local_18 + pfVar4[2];
      fVar65 = pfVar3[3] * local_18 + pfVar4[3];
      fVar58 = fVar58 + fVar61;
      fVar44 = fVar44 + fVar63;
      fVar45 = fVar45 + fVar64;
      fVar46 = fVar46 + fVar65;
      auVar67._0_4_ = fVar39 + fVar58;
      auVar67._4_4_ = fVar41 + fVar44;
      auVar67._8_4_ = fVar53 + fVar45;
      auVar67._12_4_ = fVar66 + fVar46;
      auVar38 = minps(auVar38,auVar67);
      auVar48 = maxps(auVar48,auVar67);
      fVar28 = *pfVar1 * local_18;
      fVar29 = pfVar1[1] * local_18;
      fVar30 = pfVar1[2] * local_18;
      fVar31 = pfVar1[3] * local_18;
      fVar32 = fVar32 + fVar28;
      fVar33 = fVar33 + fVar29;
      fVar56 = fVar56 + fVar30;
      fVar57 = fVar57 + fVar31;
      auVar68._0_4_ = fVar39 + fVar32;
      auVar68._4_4_ = fVar41 + fVar33;
      auVar68._8_4_ = fVar53 + fVar56;
      auVar68._12_4_ = fVar66 + fVar57;
      auVar38 = minps(auVar38,auVar68);
      auVar48 = maxps(auVar48,auVar68);
      fVar28 = fVar28 + fVar61;
      fVar29 = fVar29 + fVar63;
      fVar30 = fVar30 + fVar64;
      fVar31 = fVar31 + fVar65;
      auVar51._0_4_ = fVar39 + fVar28;
      auVar51._4_4_ = fVar41 + fVar29;
      auVar51._8_4_ = fVar53 + fVar30;
      auVar51._12_4_ = fVar66 + fVar31;
      auVar38 = minps(auVar38,auVar51);
      auVar48 = maxps(auVar48,auVar51);
      fVar39 = local_18 * (*pafVar2)[0];
      fVar41 = local_18 * (*pafVar2)[1];
      fVar53 = local_18 * (*pafVar2)[2];
      local_18 = local_18 * (*pafVar2)[3];
      fVar69 = fVar69 + fVar39;
      fVar71 = fVar71 + fVar41;
      fVar59 = fVar59 + fVar53;
      fVar60 = fVar60 + local_18;
      auVar20._4_4_ = fVar71;
      auVar20._0_4_ = fVar69;
      auVar20._8_4_ = fVar59;
      auVar20._12_4_ = fVar60;
      auVar38 = minps(auVar38,auVar20);
      auVar21._4_4_ = fVar71;
      auVar21._0_4_ = fVar69;
      auVar21._8_4_ = fVar59;
      auVar21._12_4_ = fVar60;
      auVar48 = maxps(auVar48,auVar21);
      fVar58 = fVar58 + fVar39;
      fVar44 = fVar44 + fVar41;
      fVar45 = fVar45 + fVar53;
      fVar46 = fVar46 + local_18;
      auVar18._4_4_ = fVar44;
      auVar18._0_4_ = fVar58;
      auVar18._8_4_ = fVar45;
      auVar18._12_4_ = fVar46;
      auVar38 = minps(auVar38,auVar18);
      auVar19._4_4_ = fVar44;
      auVar19._0_4_ = fVar58;
      auVar19._8_4_ = fVar45;
      auVar19._12_4_ = fVar46;
      auVar48 = maxps(auVar48,auVar19);
      fVar32 = fVar32 + fVar39;
      fVar33 = fVar33 + fVar41;
      fVar56 = fVar56 + fVar53;
      fVar57 = fVar57 + local_18;
      auVar15._4_4_ = fVar33;
      auVar15._0_4_ = fVar32;
      auVar15._8_4_ = fVar56;
      auVar15._12_4_ = fVar57;
      auVar38 = minps(auVar38,auVar15);
      auVar16._4_4_ = fVar33;
      auVar16._0_4_ = fVar32;
      auVar16._8_4_ = fVar56;
      auVar16._12_4_ = fVar57;
      auVar48 = maxps(auVar48,auVar16);
      fVar39 = fVar39 + fVar28;
      fVar41 = fVar41 + fVar29;
      fVar53 = fVar53 + fVar30;
      local_18 = local_18 + fVar31;
      auVar13._4_4_ = fVar41;
      auVar13._0_4_ = fVar39;
      auVar13._8_4_ = fVar53;
      auVar13._12_4_ = local_18;
      auVar38 = minps(auVar38,auVar13);
      auVar14._4_4_ = fVar41;
      auVar14._0_4_ = fVar39;
      auVar14._8_4_ = fVar53;
      auVar14._12_4_ = local_18;
      auVar48 = maxps(auVar48,auVar14);
      local_18 = (auVar48._0_4_ - auVar38._0_4_) * 0.5;
      fStack_14 = (auVar48._4_4_ - auVar38._4_4_) * 0.5;
      fStack_10 = (auVar48._8_4_ - auVar38._8_4_) * 0.5;
      fStack_c = (auVar48._12_4_ - auVar38._12_4_) * 0.5;
    }
  }
  else {
    local_18 = local_38 * local_18;
    fStack_14 = local_18;
    fStack_10 = local_18;
    fStack_c = local_18;
  }
  uVar22 = (**(code **)(local_68 + 0x88))(local_68 + 0x58,&local_88);
  pRVar12 = context->userContext;
  uVar25 = pRVar12->instStackSize - 1;
  pRVar12->instStackSize = uVar25;
  pRVar12->instID[uVar25] = 0xffffffff;
  pRVar12->instPrimID[pRVar12->instStackSize] = 0xffffffff;
  return (bool)uVar22;
}

Assistant:

bool InstanceArrayIntersector1::pointQuery(PointQuery* query, PointQueryContext* context, const Primitive& prim)
    {
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return false;

      const AffineSpace3fa local2world = instance->getLocal2World(prim.primID_);
      const AffineSpace3fa world2local = instance->getWorld2Local(prim.primID_);
      float similarityScale = 0.f;
      const bool similtude = context->query_type == POINT_QUERY_TYPE_SPHERE
                           && similarityTransform(world2local, &similarityScale);
      assert((similtude && similarityScale > 0) || !similtude);

      if (likely(instance_id_stack::push(context->userContext, prim.instID_, prim.primID_, world2local, local2world)))
      {
        PointQuery query_inst;
        query_inst.time = query->time;
        query_inst.p = xfmPoint(world2local, query->p); 
        query_inst.radius = query->radius * similarityScale;

        PointQueryContext context_inst(
          (Scene*)object, 
          context->query_ws, 
          similtude ? POINT_QUERY_TYPE_SPHERE : POINT_QUERY_TYPE_AABB,
          context->func,
          context->userContext,
          similarityScale,
          context->userPtr);

        bool changed = object->intersectors.pointQuery(&query_inst, &context_inst);
        instance_id_stack::pop(context->userContext);
        return changed;
      }
      return false;
    }